

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

double __thiscall HighsLpRelaxation::LpRow::getMaxAbsVal(LpRow *this,HighsMipSolver *mipsolver)

{
  pointer pHVar1;
  reference pvVar2;
  int *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  value_type local_8;
  
  iVar3 = *in_RDI;
  if (iVar3 == 0) {
    pHVar1 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x602f8b);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&pHVar1->maxAbsRowCoef,(long)in_RDI[1]);
    local_8 = *pvVar2;
  }
  else if (iVar3 == 1) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x602f5f)
    ;
    local_8 = HighsCutPool::getMaxAbsCutCoef
                        ((HighsCutPool *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                         (HighsInt)((ulong)in_RDI >> 0x20));
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double HighsLpRelaxation::LpRow::getMaxAbsVal(
    const HighsMipSolver& mipsolver) const {
  switch (origin) {
    case kCutPool:
      return mipsolver.mipdata_->cutpool.getMaxAbsCutCoef(index);
    case kModel:
      return mipsolver.mipdata_->maxAbsRowCoef[index];
  };

  assert(false);
  return 0.0;
}